

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void common_chat_templates_free(common_chat_templates *tmpls)

{
  common_chat_templates *in_RDI;
  
  if (in_RDI != (common_chat_templates *)0x0) {
    common_chat_templates::~common_chat_templates(in_RDI);
    operator_delete(in_RDI,0x18);
  }
  return;
}

Assistant:

void common_chat_templates_free(struct common_chat_templates * tmpls) {
    delete tmpls;
}